

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O1

string * __thiscall Comment::toString_abi_cxx11_(string *__return_storage_ptr__,Comment *this)

{
  string_view delimiter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ResponseBase::attribute<std::__cxx11::string>
            (&local_d0,(ResponseBase *)this,"author",&this->author);
  ResponseBase::attribute<bool>
            (&local_f0,(ResponseBase *)this,"isTopLevelComment",&this->isTopLevelComment);
  ResponseBase::attribute<std::__cxx11::string>(&local_110,(ResponseBase *)this,"id",&this->id);
  ResponseBase::attribute<std::__cxx11::string>
            (&local_130,(ResponseBase *)this,"parentId",&this->parentId);
  ResponseBase::attribute<std::__cxx11::string>
            (&local_50,(ResponseBase *)this,"threadId",&this->threadId);
  ResponseBase::attribute<std::__cxx11::string>(&local_70,(ResponseBase *)this,"link",&this->link);
  ResponseBase::attribute<unsigned_long>(&local_90,(ResponseBase *)this,"created",&this->created);
  args_6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11444f;
  ResponseBase::attribute<std::__cxx11::string>(&local_b0,(ResponseBase *)this,"body",&this->body);
  delimiter._M_str = (char *)&local_d0;
  delimiter._M_len = (size_t)"\n";
  str::
  concat<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(str *)0x1,delimiter,&local_f0,&local_110,&local_130,&local_50,
             &local_70,&local_90,&local_b0,args_6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
			return str::concat("\n",
					attribute("author", author),
					attribute("isTopLevelComment", isTopLevelComment),
					attribute("id", id),
					attribute("parentId", parentId),
					attribute("threadId", threadId),
					attribute("link", link),
					attribute("created", created),
					attribute("body", body));
		}